

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall agge::tests::RendererTests::BitmapFillRespectsFillingAreaRect(RendererTests *this)

{
  ulong uVar1;
  allocator local_189;
  blender<int,_unsigned_char> blender;
  bitmap<int,_0UL,_0UL> bitmap;
  LocationInfo local_150;
  fill_log_entry reference2 [5];
  string local_a8;
  fill_log_entry reference1 [3];
  rect_i r2;
  rect_i r1;
  
  r1.x1 = 1;
  r1.y1 = 2;
  r1.x2 = 3;
  r1.y2 = 5;
  r2.x1 = 2;
  r2.y1 = 3;
  r2.x2 = 9;
  r2.y2 = 8;
  mocks::bitmap<int,_0UL,_0UL>::bitmap(&bitmap,10,10);
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            (&bitmap,&r1,&blender);
  uVar1 = (ulong)bitmap._width;
  reference1[0].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 2 + 1;
  reference1[0].x = 1;
  reference1[0].y = 2;
  reference1[0].length = 2;
  reference1[1].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 3 + 1;
  reference1[1].x = 1;
  reference1[1].y = 3;
  reference1[2].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 4 + 1;
  reference1[2].x = 1;
  reference1[2].y = 4;
  reference1[1].length = reference1[0].length;
  reference1[2].length = reference1[0].length;
  std::__cxx11::string::string
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)&local_a8);
  ut::LocationInfo::LocationInfo((LocationInfo *)reference2,&local_150.filename,0x3ec);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,3ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            (&reference1,&blender.filling_log,(LocationInfo *)reference2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (blender.filling_log.
      super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      blender.filling_log.
      super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    blender.filling_log.
    super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         blender.filling_log.
         super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            (&bitmap,&r2,&blender);
  uVar1 = (ulong)bitmap._width;
  reference2[0].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 3 + 2;
  reference2[0].x = 2;
  reference2[0].y = 3;
  reference2[0].length = 7;
  reference2[1].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 4 + 2;
  reference2[1].x = 2;
  reference2[1].y = 4;
  reference2[2].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 5 + 2;
  reference2[2].x = 2;
  reference2[2].y = 5;
  reference2[3].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 6 + 2;
  reference2[3].x = 2;
  reference2[3].y = 6;
  reference2[4].pixels =
       bitmap.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start + uVar1 * 7 + 2;
  reference2[4].x = 2;
  reference2[4].y = 7;
  reference2[1].length = reference2[0].length;
  reference2[2].length = reference2[0].length;
  reference2[3].length = reference2[0].length;
  reference2[4].length = reference2[0].length;
  std::__cxx11::string::string
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_189);
  ut::LocationInfo::LocationInfo(&local_150,&local_a8,0x3fd);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,5ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            (&reference2,&blender.filling_log,&local_150);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  _Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                   *)&blender);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&bitmap);
  return;
}

Assistant:

test( BitmapFillRespectsFillingAreaRect )
			{
				// INIT
				rect_i r1 = { 1, 2, 3, 5 };
				rect_i r2 = { 2, 3, 9, 8 };
				mocks::bitmap<int> bitmap(10, 10);
				mocks::blender<int, uint8_t> blender;

				// ACT
				fill(bitmap, r1, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference1[] = {
					{ bitmap.row_ptr(2) + 1, 1, 2, 2 },
					{ bitmap.row_ptr(3) + 1, 1, 3, 2 },
					{ bitmap.row_ptr(4) + 1, 1, 4, 2 },
				};

				assert_equal(reference1, blender.filling_log);

				// INIT
				blender.filling_log.clear();

				// ACT
				fill(bitmap, r2, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference2[] = {
					{ bitmap.row_ptr(3) + 2, 2, 3, 7 },
					{ bitmap.row_ptr(4) + 2, 2, 4, 7 },
					{ bitmap.row_ptr(5) + 2, 2, 5, 7 },
					{ bitmap.row_ptr(6) + 2, 2, 6, 7 },
					{ bitmap.row_ptr(7) + 2, 2, 7, 7 },
				};

				assert_equal(reference2, blender.filling_log);
			}